

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall HModel::initRandomVec(HModel *this)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  std::vector<int,_std::allocator<int>_>::resize(&this->intBreak,(long)this->numTot);
  uVar7 = this->numTot;
  if (0 < (int)uVar7) {
    piVar2 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      piVar2[lVar8] = (int)lVar8;
      lVar8 = lVar8 + 1;
      uVar7 = this->numTot;
    } while (lVar8 < (int)uVar7);
  }
  if (1 < (int)uVar7) {
    piVar2 = (this->intBreak).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (ulong)uVar7;
    do {
      uVar7 = (this->random).random_mw;
      uVar6 = (this->random).random_mz;
      uVar6 = (uVar6 >> 0x10) + (uVar6 & 0xffff) * 0x9069;
      (this->random).random_mz = uVar6;
      uVar7 = (uVar7 >> 0x10) + (uVar7 & 0xffff) * 18000;
      (this->random).random_mw = uVar7;
      uVar5 = (ulong)(uVar6 * 0x10000 + uVar7 >> 1) % (uVar9 & 0xffffffff);
      iVar1 = piVar2[uVar9 - 1];
      piVar2[uVar9 - 1] = piVar2[uVar5];
      piVar2[uVar5] = iVar1;
      bVar4 = 2 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar4);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->dblXpert,(long)this->numTot);
  iVar1 = this->numTot;
  if (0 < (long)iVar1) {
    pdVar3 = (this->dblXpert).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (this->random).random_mw;
    uVar6 = (this->random).random_mz;
    lVar8 = 0;
    do {
      uVar6 = (uVar6 >> 0x10) + (uVar6 & 0xffff) * 0x9069;
      uVar7 = (uVar7 >> 0x10) + (uVar7 & 0xffff) * 18000;
      pdVar3[lVar8] = ((double)(uVar6 * 0x10000 + uVar7) + 1.0) * 2.328306435454494e-10;
      lVar8 = lVar8 + 1;
    } while (iVar1 != lVar8);
    (this->random).random_mz = uVar6;
    (this->random).random_mw = uVar7;
  }
  return;
}

Assistant:

void HModel::initRandomVec() {
  intBreak.resize(numTot);
  for (int i = 0; i < numTot; i++)
    intBreak[i] = i;
  for (int i = numTot - 1; i >= 1; i--) {
    int j = random.intRandom() % (i + 1);
    swap(intBreak[i], intBreak[j]);
  }
  dblXpert.resize(numTot);
  for (int i = 0; i < numTot; i++)
    dblXpert[i] = random.dblRandom();
  
}